

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

void __thiscall QTextDocument::markContentsDirty(QTextDocument *this,int from,int length)

{
  QTextDocumentPrivate *pQVar1;
  undefined8 in_RDI;
  int length_00;
  QTextDocumentPrivate *d;
  int in_stack_0000001c;
  
  length_00 = (int)((ulong)in_RDI >> 0x20);
  pQVar1 = d_func((QTextDocument *)0x7ab22f);
  QTextDocumentPrivate::documentChange(d,in_stack_0000001c,length_00);
  if (((pQVar1->inContentsChange & 1U) == 0) && (pQVar1->lout != (QAbstractTextDocumentLayout *)0x0)
     ) {
    (**(code **)(*(long *)pQVar1->lout + 0x90))
              (pQVar1->lout,pQVar1->docChangeFrom,pQVar1->docChangeOldLength,pQVar1->docChangeLength
              );
    pQVar1->docChangeFrom = -1;
  }
  return;
}

Assistant:

void QTextDocument::markContentsDirty(int from, int length)
{
    Q_D(QTextDocument);
    d->documentChange(from, length);
    if (!d->inContentsChange) {
        if (d->lout) {
            d->lout->documentChanged(d->docChangeFrom, d->docChangeOldLength, d->docChangeLength);
            d->docChangeFrom = -1;
        }
    }
}